

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

string * __thiscall
cmCTestGIT::FindGitDir_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  bool bVar1;
  char *git_rev_parse [4];
  string git_dir_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  OutputLogger rev_parse_err;
  OneLineParser rev_parse_out;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  git_rev_parse[0] = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  git_rev_parse[1] = "rev-parse";
  git_rev_parse[2] = "--git-dir";
  git_rev_parse[3] = (char *)0x0;
  git_dir_line._M_dataplus._M_p = (pointer)&git_dir_line.field_2;
  git_dir_line._M_string_length = 0;
  git_dir_line.field_2._M_local_buf[0] = '\0';
  OneLineParser::OneLineParser(&rev_parse_out,this,"rev-parse-out> ",&git_dir_line);
  cmProcessTools::OutputLogger::OutputLogger
            (&rev_parse_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rev-parse-err> ");
  bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,git_rev_parse,(OutputParser *)&rev_parse_out,
                              (OutputParser *)&rev_parse_err,(char *)0x0,UTF8);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  if (*(__return_storage_ptr__->_M_dataplus)._M_p == '.') {
    std::operator+(&local_d8,&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/");
    std::operator+(&local_b8,&local_d8,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  cmProcessTools::LineParser::~LineParser(&rev_parse_err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&rev_parse_out.super_LineParser);
  std::__cxx11::string::~string((string *)&git_dir_line);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::FindGitDir()
{
  std::string git_dir;

  // Run "git rev-parse --git-dir" to locate the real .git directory.
  const char* git = this->CommandLineTool.c_str();
  char const* git_rev_parse[] = { git, "rev-parse", "--git-dir", nullptr };
  std::string git_dir_line;
  OneLineParser rev_parse_out(this, "rev-parse-out> ", git_dir_line);
  OutputLogger rev_parse_err(this->Log, "rev-parse-err> ");
  if (this->RunChild(git_rev_parse, &rev_parse_out, &rev_parse_err, nullptr,
                     cmProcessOutput::UTF8)) {
    git_dir = git_dir_line;
  }
  if (git_dir.empty()) {
    git_dir = ".git";
  }

  // Git reports a relative path only when the .git directory is in
  // the current directory.
  if (git_dir[0] == '.') {
    git_dir = this->SourceDirectory + "/" + git_dir;
  }
#if defined(_WIN32) && !defined(__CYGWIN__)
  else if (git_dir[0] == '/') {
    // Cygwin Git reports a full path that Cygwin understands, but we
    // are a Windows application.  Run "cygpath" to get Windows path.
    std::string cygpath_exe =
      cmStrCat(cmSystemTools::GetFilenamePath(git), "/cygpath.exe");
    if (cmSystemTools::FileExists(cygpath_exe)) {
      char const* cygpath[] = { cygpath_exe.c_str(), "-w", git_dir.c_str(),
                                0 };
      OneLineParser cygpath_out(this, "cygpath-out> ", git_dir_line);
      OutputLogger cygpath_err(this->Log, "cygpath-err> ");
      if (this->RunChild(cygpath, &cygpath_out, &cygpath_err, nullptr,
                         cmProcessOutput::UTF8)) {
        git_dir = git_dir_line;
      }
    }
  }
#endif
  return git_dir;
}